

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HestonLogSpotPathSimulator.cpp
# Opt level: O2

void __thiscall BroadieKayaScheme::preComputations(BroadieKayaScheme *this)

{
  pointer pdVar1;
  ulong uVar2;
  double dVar3;
  ulong extraout_XMM0_Qb;
  HestonModel hestonModel;
  double local_e8;
  double local_e0;
  double local_d8;
  ulong uStack_d0;
  vector<double,_std::allocator<double>_> *local_c0;
  vector<double,_std::allocator<double>_> *local_b8;
  double local_b0;
  double local_a8;
  ulong uStack_a0;
  double local_98;
  ulong uStack_90;
  double local_88;
  ulong uStack_80;
  HestonModel local_70;
  
  HestonVariancePathSimulator::getHestonModel
            (&local_70,(this->super_HestonLogSpotPathSimulator).variancePathSimulator_);
  local_d8 = HestonModel::getCorrelation(&local_70);
  uStack_d0 = extraout_XMM0_Qb;
  dVar3 = HestonModel::getMeanReversionLevel(&local_70);
  local_e0 = HestonModel::getMeanReversionSpeed(&local_70);
  local_b0 = HestonModel::getVolOfVol(&local_70);
  local_b8 = &this->k0_;
  uStack_90 = uStack_d0 ^ 0x8000000000000000;
  local_98 = -local_d8 * local_e0 * dVar3;
  local_e0 = (local_e0 * local_d8) / local_b0 + -0.5;
  local_c0 = &this->k1_;
  local_a8 = local_d8 / local_b0;
  uStack_a0 = uStack_d0;
  local_88 = -local_a8;
  uStack_80 = uStack_d0 ^ 0x8000000000000000;
  local_d8 = 1.0 - local_d8 * local_d8;
  for (uVar2 = 0;
      pdVar1 = (this->super_HestonLogSpotPathSimulator).super_PathSimulator.timePoints_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,
      uVar2 < ((long)(this->super_HestonLogSpotPathSimulator).super_PathSimulator.timePoints_.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) - 1U; uVar2 = uVar2 + 1)
  {
    dVar3 = pdVar1[uVar2 + 1] - pdVar1[uVar2];
    local_e8 = (local_98 * dVar3) / local_b0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_b8,&local_e8);
    local_e8 = this->gamma1_ * dVar3 * local_e0 + local_88;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_c0,&local_e8);
    local_e8 = this->gamma2_ * dVar3 * local_e0 + local_a8;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->k2_,&local_e8);
    local_e8 = this->gamma1_ * dVar3 * local_d8;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->k3_,&local_e8);
    local_e8 = dVar3 * this->gamma2_ * local_d8;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->k4_,&local_e8);
  }
  return;
}

Assistant:

void BroadieKayaScheme::preComputations()
{
    HestonModel hestonModel = variancePathSimulator_->getHestonModel();
    double rho = hestonModel.getCorrelation();
    double theta = hestonModel.getMeanReversionLevel();
    double kappa = hestonModel.getMeanReversionSpeed();
    double eps = hestonModel.getVolOfVol();
    double delta;

    //NB : we allow the time grid to be non-equidistant so that the computed quantities are time dependent
    for(std::size_t i = 0; i < timePoints_.size()-1; i++)
    {
        delta = timePoints_[i+1] - timePoints_[i];
        k0_.push_back(-rho*kappa*theta*delta/eps);
        k1_.push_back(gamma1_*delta*(kappa*rho/eps-0.5)-rho/eps);
        k2_.push_back(gamma2_*delta*(kappa*rho/eps-0.5)+rho/eps);
        k3_.push_back(gamma1_*delta*(1.-rho*rho));
        k4_.push_back(gamma2_*delta*(1.-rho*rho));
    }
}